

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeDataDrop(TranslateToFuzzReader *this)

{
  uint32_t uVar1;
  DataDrop *pDVar2;
  Expression *pEVar3;
  
  if (this->allowMemory != false) {
    uVar1 = Random::upTo(&this->random,
                         (uint32_t)
                         ((ulong)((long)(this->wasm->dataSegments).
                                        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->wasm->dataSegments).
                                       super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3));
    pDVar2 = Builder::makeDataDrop
                       (&this->builder,
                        (Name)*(string_view *)
                               (this->wasm->dataSegments).
                               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_t.
                               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                       );
    return (Expression *)pDVar2;
  }
  pEVar3 = makeTrivial(this,(Type)0x0);
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeDataDrop() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Index segIdx = upTo(wasm.dataSegments.size());
  Name segment = wasm.dataSegments[segIdx]->name;
  return builder.makeDataDrop(segment);
}